

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

double ibeta(double x,double a,double b)

{
  char *__format;
  double dVar1;
  int local_1c;
  double dStack_18;
  int ctrlint;
  double local_10;
  
  if ((x < 0.0) || (1.0 < x)) {
    __format = "x only accepts real values between 0.0 and 1.0";
  }
  else {
    if ((0.0 <= a) && (0.0 <= b)) {
      local_1c = 0;
      dVar1 = a + b;
      dStack_18 = b;
      if (x < (a + 1.0) / (dVar1 + 2.0)) {
        local_10 = gamma_log(dVar1);
        dVar1 = gamma_log(a + 1.0);
        local_10 = local_10 - dVar1;
        dVar1 = gamma_log(dStack_18);
        local_10 = local_10 - dVar1;
        dVar1 = log(x);
        local_10 = dVar1 * a + local_10;
        dVar1 = log1p(-x);
        local_10 = exp(dVar1 * dStack_18 + local_10);
        dVar1 = bfrac(x,a,dStack_18,&local_1c);
        dVar1 = dVar1 * local_10;
      }
      else {
        local_10 = gamma_log(dVar1);
        dVar1 = gamma_log(dStack_18 + 1.0);
        local_10 = local_10 - dVar1;
        dVar1 = gamma_log(a);
        local_10 = local_10 - dVar1;
        dVar1 = log(x);
        local_10 = dVar1 * a + local_10;
        dVar1 = log1p(-x);
        local_10 = exp(dVar1 * dStack_18 + local_10);
        dVar1 = bfrac(1.0 - x,dStack_18,a,&local_1c);
        dVar1 = 1.0 - dVar1 * local_10;
      }
      if (local_1c != 1000) {
        return dVar1;
      }
      dVar1 = ibeta_appx(x,a,dStack_18);
      return dVar1;
    }
    __format = " The Two Inputs should be nonnegative and real";
  }
  printf(__format);
  exit(1);
}

Assistant:

double ibeta(double x, double a , double b) {
	double oup,temp;
	int ctrlint;
	/*
	 * This program uses two methods described in Abramowitz and Stegun
	 * Handbook.
	 * Method 1. is based on 26.5.8 and uses Continued Fraction. The result
	 * is accepted if the convergence occurs in 1000 iterations.
	 * 
	 * If the program doesn't converge , then the results are discarded and 
	 * method 2. is used.
	 * 
	 * Method 2. uses approximation and is based on equations 26.5.20 (erf)
	 * and 26.5.21 (pgamma/qgamma) 
	 */ 
	if (x < 0. || x > 1.) {
		printf("x only accepts real values between 0.0 and 1.0");
		exit(1);
	}
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	}
	
	ctrlint = 0;
	
	// Method 1
	
	if ( x < (a+1.)/(a+b+2.)) {
		temp = exp(gamma_log(a+b) - gamma_log(a+1.) - gamma_log(b) + a*log(x) + b*log1p(-x));
		oup = temp * bfrac(x,a,b,&ctrlint); 
	}
	
	if ( x >= (a+1.)/(a+b+2.)) {
		temp = exp(gamma_log(a+b) - gamma_log(b+1.) - gamma_log(a) + a*log(x) + b*log1p(-x));
		oup = 1. - temp * bfrac(1. - x,b,a,&ctrlint); 
	}
	
	// Method 2 is invoked only if ctrlint = 1000
	if (ctrlint == 1000) {
		oup = 0.0;
		oup = ibeta_appx(x,a,b);
	}
	
	return oup;
	
}